

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::Dequeue(Worker *this)

{
  CURLM *pCVar1;
  EasyHandle *pEVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  unsigned_long *puVar6;
  reference __x;
  pointer this_00;
  mapped_type *this_01;
  handle_t pCVar7;
  CurlException *this_02;
  allocator local_1d9;
  string local_1d8 [36];
  CURLMcode local_1b4;
  handle_t pCStack_1b0;
  CURLMcode mc;
  EasyHandle *local_1a8;
  EasyHandle *eh;
  unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *req;
  iterator __end2;
  iterator __begin2;
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  *__range2;
  const_iterator local_130;
  iterator local_110;
  const_iterator local_f0;
  iterator local_d0;
  undefined1 local_b0 [8];
  iterator it;
  unsigned_long local_88;
  unsigned_long local_80;
  unsigned_long remains;
  lock_guard<std::mutex> local_68;
  lock_t lock;
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  tmp;
  Worker *this_local;
  
  std::
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::deque((deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
           *)&lock);
  std::lock_guard<std::mutex>::lock_guard(&local_68,&this->mutex_);
  sVar4 = std::
          deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
          ::size(&this->queue_);
  sVar5 = std::
          map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
          ::size(&this->ongoing_);
  if (sVar4 + sVar5 < 0x21) {
    std::
    deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
    ::operator=((deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                 *)&lock,&this->queue_);
    this->pending_entries_in_queue_ = false;
  }
  else {
    sVar5 = std::
            map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
            ::size(&this->ongoing_);
    local_88 = 0x20 - sVar5;
    it._M_node = (_Map_pointer)
                 std::
                 deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                 ::size(&this->queue_);
    puVar6 = std::min<unsigned_long>(&local_88,(unsigned_long *)&it._M_node);
    local_80 = *puVar6;
    if (local_80 == 0) {
      sVar5 = std::
              map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
              ::size(&this->ongoing_);
      if (sVar5 != 0x20) {
        __assert_fail("ongoing_.size() == RESTINCURL_MAX_CONNECTIONS",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                      ,900,"void restincurl::Worker::Dequeue()");
      }
    }
    else {
      std::
      deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ::begin((iterator *)local_b0,&this->queue_);
      while (local_80 != 0) {
        local_80 = local_80 - 1;
        std::
        deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
        ::end(&local_d0,&this->queue_);
        bVar3 = std::operator!=((_Self *)local_b0,&local_d0);
        if (!bVar3) {
          __assert_fail("it != queue_.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                        ,0x37e,"void restincurl::Worker::Dequeue()");
        }
        __x = std::
              _Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
              ::operator*((_Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
                           *)local_b0);
        std::
        deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
        ::push_back((deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                     *)&lock,__x);
        std::
        _Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
        ::operator++((_Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
                      *)local_b0);
      }
      local_80 = local_80 - 1;
      std::
      deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ::begin(&local_110,&this->queue_);
      std::
      _Deque_iterator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const&,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const*>
      ::
      _Deque_iterator<std::_Deque_iterator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>&,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>*>,void>
                ((_Deque_iterator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const&,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const*>
                  *)&local_f0,&local_110);
      std::
      _Deque_iterator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const&,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const*>
      ::
      _Deque_iterator<std::_Deque_iterator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>&,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>*>,void>
                ((_Deque_iterator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const&,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>const*>
                  *)&local_130,
                 (_Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
                  *)local_b0);
      std::
      deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ::erase((iterator *)&__range2,&this->queue_,&local_f0,&local_130);
    }
    this->pending_entries_in_queue_ = true;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_68);
  std::
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::begin((iterator *)&__end2._M_node,
          (deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
           *)&lock);
  std::
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::end((iterator *)&req,
        (deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
         *)&lock);
  while( true ) {
    bVar3 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&req);
    if (!bVar3) {
      std::
      deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ::~deque((deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                *)&lock);
      return;
    }
    eh = (EasyHandle *)
         std::
         _Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
         ::operator*((_Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
                      *)&__end2._M_node);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)eh);
    if (!bVar3) break;
    this_00 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
              operator->((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>
                          *)eh);
    local_1a8 = Request::GetEasyHandle(this_00);
    pEVar2 = eh;
    pCStack_1b0 = EasyHandle::operator_cast_to_void_(local_1a8);
    this_01 = std::
              map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
              ::operator[](&this->ongoing_,&stack0xfffffffffffffe50);
    std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::operator=
              (this_01,(unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *
                       )pEVar2);
    pCVar1 = this->handle_;
    pCVar7 = EasyHandle::operator_cast_to_void_(local_1a8);
    local_1b4 = curl_multi_add_handle(pCVar1,pCVar7);
    if (local_1b4 != CURLM_OK) {
      this_02 = (CurlException *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"curl_multi_add_handle",&local_1d9);
      CurlException::CurlException(this_02,(string *)local_1d8,local_1b4);
      __cxa_throw(this_02,&CurlException::typeinfo,CurlException::~CurlException);
    }
    std::
    _Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
    ::operator++((_Deque_iterator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_&,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_*>
                  *)&__end2._M_node);
  }
  __assert_fail("req",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x38d,"void restincurl::Worker::Dequeue()");
}

Assistant:

void Dequeue() {
            decltype(queue_) tmp;

            {
                lock_t lock(mutex_);
                if ((queue_.size() + ongoing_.size()) <= RESTINCURL_MAX_CONNECTIONS) {
                    tmp = std::move(queue_);
                    pending_entries_in_queue_ = false;
                } else {
                    auto remains = std::min<size_t>(RESTINCURL_MAX_CONNECTIONS - ongoing_.size(), queue_.size());
                    if (remains) {
                        auto it = queue_.begin();
                        RESTINCURL_LOG_TRACE("Adding only " << remains << " of " << queue_.size()
                            << " requests from queue: << RESTINCURL_MAX_CONNECTIONS=" << RESTINCURL_MAX_CONNECTIONS);
                        while(remains--) {
                            assert(it != queue_.end());
                            tmp.push_back(std::move(*it));
                            ++it;
                        }
                        queue_.erase(queue_.begin(), it);
                    } else {
                        assert(ongoing_.size() == RESTINCURL_MAX_CONNECTIONS);
                        RESTINCURL_LOG_TRACE("Adding no entries from queue: RESTINCURL_MAX_CONNECTIONS="
                            << RESTINCURL_MAX_CONNECTIONS);
                    }
                    pending_entries_in_queue_ = true;
                }
            }

            for(auto& req: tmp) {
                assert(req);
                const auto& eh = req->GetEasyHandle();
                RESTINCURL_LOG_TRACE("Adding request: " << eh);
                ongoing_[eh] = std::move(req);
                const auto mc = curl_multi_add_handle(handle_, eh);
                if (mc != CURLM_OK) {
                    throw CurlException("curl_multi_add_handle", mc);
                }
            }
        }